

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv4Transmitter::JoinMulticastGroup(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  uint uVar1;
  RTPMemoryManager *pRVar2;
  HashElement *pHVar3;
  int iVar4;
  HashElement *pHVar5;
  uint uVar6;
  uint32_t mcastIP;
  ip_mreq mreq;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  iVar4 = -0x5a;
  if (((this->init == true) && (iVar4 = -0x59, this->created == true)) &&
     (iVar4 = -0x54, addr->addresstype == IPv4Address)) {
    uVar1 = *(uint *)&addr->field_0xc;
    iVar4 = -0x58;
    if ((uVar1 & 0xf0000000) == 0xe0000000) {
      uVar6 = uVar1 % 0x207d;
      for (pHVar5 = (this->multicastgroups).table[uVar6]; pHVar5 != (HashElement *)0x0;
          pHVar5 = pHVar5->hashnext) {
        if (pHVar5->element == uVar1) {
          return -4;
        }
      }
      pRVar2 = (this->multicastgroups).super_RTPMemoryObject.mgr;
      local_2c = uVar1;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        pHVar5 = (HashElement *)operator_new(0x28);
      }
      else {
        pHVar5 = (HashElement *)
                 (**(code **)(*(long *)pRVar2 + 0x10))
                           (pRVar2,0x28,(this->multicastgroups).memorytype);
      }
      pHVar5->element = uVar1;
      pHVar5->hashprev = (HashElement *)0x0;
      pHVar5->hashnext = (HashElement *)0x0;
      pHVar5->listprev = (HashElement *)0x0;
      pHVar5->listnext = (HashElement *)0x0;
      pHVar5->hashindex = uVar6;
      pHVar3 = (this->multicastgroups).table[uVar6];
      (this->multicastgroups).table[uVar6] = pHVar5;
      pHVar5->hashnext = pHVar3;
      if (pHVar3 != (HashElement *)0x0) {
        pHVar3->hashprev = pHVar5;
      }
      if ((this->multicastgroups).firsthashelem == (HashElement *)0x0) {
        (this->multicastgroups).firsthashelem = pHVar5;
      }
      else {
        pHVar3 = (this->multicastgroups).lasthashelem;
        pHVar3->listnext = pHVar5;
        pHVar5->listprev = pHVar3;
      }
      (this->multicastgroups).lasthashelem = pHVar5;
      uVar6 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = this->mcastifaceIP;
      local_24 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      local_28 = uVar6;
      iVar4 = setsockopt(this->rtpsock,0,0x23,&local_28,8);
      if (iVar4 == 0) {
        if (this->rtpsock == this->rtcpsock) {
          return 0;
        }
        uVar1 = this->mcastifaceIP;
        local_24 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        local_28 = uVar6;
        iVar4 = setsockopt(this->rtcpsock,0,0x23,&local_28,8);
        if (iVar4 == 0) {
          return 0;
        }
        local_28 = local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 |
                   local_2c << 0x18;
        uVar1 = this->mcastifaceIP;
        local_24 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        setsockopt(this->rtpsock,0,0x24,&local_28,8);
      }
      RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
      DeleteElement(&this->multicastgroups,&local_2c);
      iVar4 = -0x51;
    }
  }
  return iVar4;
}

Assistant:

int RTPUDPv4Transmitter::JoinMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	uint32_t mcastIP = address.GetIP();
	
	if (!RTPUDPV4TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.AddElement(mcastIP);
	if (status >= 0)
	{
		RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
		if (status != 0)
		{
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
		}

		if (rtpsock != rtcpsock) // no need to join multicast group twice when multiplexing
		{
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
			if (status != 0)
			{
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
				multicastgroups.DeleteElement(mcastIP);
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
			}
		}
	}
	MAINMUTEX_UNLOCK	
	return status;
}